

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

void __thiscall Js::FunctionBody::CreateReferencedPropertyIdMap(FunctionBody *this)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  BOOL BVar4;
  void *pvVar5;
  undefined4 *puVar6;
  Recycler *this_00;
  char *ptr;
  ulong uVar7;
  uint i;
  ulong uVar8;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  pvVar5 = FunctionProxy::GetAuxPtr((FunctionProxy *)this,ReferencedPropertyIdMap);
  if (pvVar5 != (void *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x10bd,"(this->GetReferencedPropertyIdMap() == nullptr)",
                                "this->GetReferencedPropertyIdMap() == nullptr");
    if (!bVar2) goto LAB_007683a5;
    *puVar6 = 0;
  }
  uVar3 = GetCountField(this,ReferencedPropertyIdCount);
  if (uVar3 != 0) {
    uVar7 = (ulong)uVar3;
    local_50 = (undefined1  [8])&int::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_2ab02c8;
    data.filename._0_4_ = 0x10c1;
    data.plusSize = uVar7;
    this_00 = Memory::Recycler::TrackAllocInfo
                        (((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
                         recycler,(TrackAllocData *)local_50);
    BVar4 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar4 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar2) goto LAB_007683a5;
      *puVar6 = 0;
    }
    ptr = Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                    (this_00,uVar7 * 4);
    if (ptr == (char *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar2) {
LAB_007683a5:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar6 = 0;
    }
    FunctionProxy::SetAuxPtr((FunctionProxy *)this,ReferencedPropertyIdMap,ptr);
    uVar8 = 0;
    do {
      pvVar5 = FunctionProxy::GetAuxPtr((FunctionProxy *)this,ReferencedPropertyIdMap);
      *(undefined4 *)((long)pvVar5 + uVar8 * 4) = 0xffffffff;
      uVar8 = uVar8 + 1;
    } while (uVar7 != uVar8);
  }
  return;
}

Assistant:

void FunctionBody::CreateReferencedPropertyIdMap()
    {
        Assert(this->GetReferencedPropertyIdMap() == nullptr);
        uint count = this->GetReferencedPropertyIdCount();
        if (count!= 0)
        {
            this->SetReferencedPropertyIdMap(RecyclerNewArrayLeaf(this->m_scriptContext->GetRecycler(), PropertyId, count));
#if DBG
            for (uint i = 0; i < count; i++)
            {
                this->GetReferencedPropertyIdMap()[i] = Js::Constants::NoProperty;
            }
#endif
        }
    }